

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Raytracer::Image::Save(Image *this,string *name)

{
  ostream *poVar1;
  int local_22c;
  int local_228;
  int x;
  int y;
  string local_218 [8];
  ofstream file;
  string *name_local;
  Image *this_local;
  
  std::ofstream::ofstream(local_218);
  std::operator|(_S_out,_S_bin);
  std::ofstream::open(local_218,(_Ios_Openmode)name);
  poVar1 = std::operator<<((ostream *)local_218,"P6\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::operator<<(poVar1,"\n255\n");
  for (local_228 = 0; local_228 < this->height; local_228 = local_228 + 1) {
    for (local_22c = 0; local_22c < this->width; local_22c = local_22c + 1) {
      std::operator<<((ostream *)local_218,(char)(int)this->datas[local_228][local_22c].r);
      std::operator<<((ostream *)local_218,(char)(int)this->datas[local_228][local_22c].g);
      std::operator<<((ostream *)local_218,(char)(int)this->datas[local_228][local_22c].b);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Raytracer::Image::Save(std::string name) {
    std::ofstream file;
    file.open(name, std::ofstream::out | std::ofstream::binary);
    file << "P6\n" << width << " " << height << "\n255\n";
    for(int y = 0;y<height;y++){
        for(int x = 0;x<width;x++){
              file << (char)datas[y][x].r;
              file << (char)datas[y][x].g;
              file << (char)datas[y][x].b;

        }
    }
    file.close();
}